

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O3

EStatusCode __thiscall
CFFPrimitiveWriter::Write(CFFPrimitiveWriter *this,Byte *inBuffer,LongBufferSizeType inBufferSize)

{
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  
  EVar1 = eFailure;
  if (this->mInternalState != eFailure) {
    iVar2 = (*this->mCFFOutput->_vptr_IByteWriter[2])();
    EVar1 = eSuccess;
    if (CONCAT44(extraout_var,iVar2) != inBufferSize) {
      this->mInternalState = eFailure;
      EVar1 = eFailure;
    }
  }
  return EVar1;
}

Assistant:

EStatusCode CFFPrimitiveWriter::Write(const Byte* inBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;
    
	EStatusCode status = (mCFFOutput->Write(inBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);
    
	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;
}